

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O3

void Abc_NtkMaxFlowCollectCut_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  long lVar7;
  
  pAVar4 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pObj->pNtk;
  iVar2 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar5->vTravIds).pArray[iVar1] = iVar2;
    if ((pObj->field_0x14 & 0x10) == 0) {
      if (0 < (pObj->vFanins).nSize) {
        lVar7 = 0;
        do {
          Abc_NtkMaxFlowCollectCut_rec
                    ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]],vNodes);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pObj->vFanins).nSize);
      }
    }
    else {
      uVar3 = vNodes->nSize;
      if (uVar3 == vNodes->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar6 = vNodes->pArray;
      }
      iVar1 = vNodes->nSize;
      vNodes->nSize = iVar1 + 1;
      ppvVar6[iVar1] = pObj;
    }
  }
  return;
}

Assistant:

void Abc_NtkMaxFlowCollectCut_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( pObj->fMarkA )
    {
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    Abc_ObjForEachFanin( pObj, pNext, i )
        Abc_NtkMaxFlowCollectCut_rec( pNext, vNodes );
}